

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

stb_vorbis * stb_vorbis_open_filename(char *filename,int *error,stb_vorbis_alloc *alloc)

{
  FILE *file;
  FILE *f;
  stb_vorbis_alloc *alloc_local;
  int *error_local;
  char *filename_local;
  
  file = fopen(filename,"rb");
  if (file == (FILE *)0x0) {
    if (error != (int *)0x0) {
      *error = 6;
    }
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)stb_vorbis_open_file((FILE *)file,1,error,alloc);
  }
  return (stb_vorbis *)filename_local;
}

Assistant:

stb_vorbis * stb_vorbis_open_filename(const char *filename, int *error, const stb_vorbis_alloc *alloc)
{
   FILE *f;
#if defined(_WIN32) && defined(__STDC_WANT_SECURE_LIB__)
   if (0 != fopen_s(&f, filename, "rb"))
      f = NULL;
#else
   f = fopen(filename, "rb");
#endif
   if (f)
      return stb_vorbis_open_file(f, TRUE, error, alloc);
   if (error) *error = VORBIS_file_open_failure;
   return NULL;
}